

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBufferCopyTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::BufferCopyTests::init(BufferCopyTests *this,EVP_PKEY_CTX *ctx)

{
  deUint32 dVar1;
  deUint32 dVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  TestNode *pTVar6;
  char *pcVar7;
  long *plVar8;
  BufferCase *pBVar9;
  TestNode *pTVar10;
  long *extraout_RAX;
  long *extraout_RAX_00;
  long *plVar11;
  long lVar12;
  long lVar13;
  string name;
  allocator<char> local_b9;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  size_type local_78;
  undefined8 uStack_70;
  TestNode *local_60;
  TestNode *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"basic",
             "Basic buffer copy cases");
  local_60 = (TestNode *)this;
  local_58 = pTVar6;
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  lVar12 = 0;
  local_78 = 0;
  do {
    lVar13 = 0;
    do {
      if (lVar12 != lVar13) {
        dVar1 = init::bufferTargets[local_78];
        dVar2 = *(deUint32 *)((long)init::bufferTargets + lVar13);
        pcVar7 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar1);
        std::__cxx11::string::string<std::allocator<char>>((string *)local_50,pcVar7,&local_b9);
        plVar8 = (long *)std::__cxx11::string::append((char *)local_50);
        local_b8 = &local_a8;
        plVar11 = plVar8 + 2;
        if ((long *)*plVar8 == plVar11) {
          local_a8 = *plVar11;
          lStack_a0 = plVar8[3];
        }
        else {
          local_a8 = *plVar11;
          local_b8 = (long *)*plVar8;
        }
        local_b0 = plVar8[1];
        *plVar8 = (long)plVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        deqp::gls::BufferTestUtil::getBufferTargetName(dVar2);
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_b8);
        local_98 = &local_88;
        plVar11 = plVar8 + 2;
        if ((long *)*plVar8 == plVar11) {
          local_88 = *plVar11;
          lStack_80 = plVar8[3];
        }
        else {
          local_88 = *plVar11;
          local_98 = (long *)*plVar8;
        }
        local_90 = plVar8[1];
        *plVar8 = (long)plVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if (local_b8 != &local_a8) {
          operator_delete(local_b8,local_a8 + 1);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        pBVar9 = (BufferCase *)operator_new(0xe8);
        deqp::gls::BufferTestUtil::BufferCase::BufferCase
                  (pBVar9,((Context *)local_60[1]._vptr_TestNode)->m_testCtx,
                   ((Context *)local_60[1]._vptr_TestNode)->m_renderCtx,(char *)local_98,
                   glcts::fixed_sample_locations_values + 1);
        (pBVar9->super_TestCase).super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__BufferCase_02147928;
        *(deUint32 *)&pBVar9[1].super_TestCase.super_TestNode._vptr_TestNode = dVar1;
        *(undefined8 *)((long)&pBVar9[1].super_TestCase.super_TestNode._vptr_TestNode + 4) =
             0x88e4000003f9;
        *(deUint32 *)((long)&pBVar9[1].super_TestCase.super_TestNode.m_testCtx + 4) = dVar2;
        pBVar9[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x88e4000003f9;
        pBVar9[1].super_TestCase.super_TestNode.m_name._M_string_length = 0;
        pBVar9[1].super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0x3f9;
        tcu::TestNode::addChild(local_58,(TestNode *)pBVar9);
        if (local_98 != &local_88) {
          operator_delete(local_98,local_88 + 1);
        }
      }
      lVar13 = lVar13 + 4;
    } while (lVar13 != 0x20);
    local_78 = local_78 + 1;
    lVar12 = lVar12 + 4;
  } while (local_78 != 8);
  pTVar10 = (TestNode *)operator_new(0x70);
  pTVar6 = local_60;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar10,local_60->m_testCtx,"subrange","Buffer subrange copy tests");
  tcu::TestNode::addChild(pTVar6,pTVar10);
  lVar12 = 0x18;
  do {
    pBVar9 = (BufferCase *)operator_new(0xe8);
    uVar3 = *(undefined4 *)((long)&PTR_iterate_02147810 + lVar12);
    uVar4 = *(undefined4 *)((long)&PTR_iterate_02147810 + lVar12 + 4);
    local_78 = *(size_type *)(&UNK_02147818 + lVar12);
    uStack_70 = 0;
    uVar5 = *(undefined4 *)((long)&init::cases[0].name + lVar12);
    deqp::gls::BufferTestUtil::BufferCase::BufferCase
              (pBVar9,(TestContext *)*pTVar6[1]._vptr_TestNode,
               (RenderContext *)pTVar6[1]._vptr_TestNode[1],
               *(char **)((long)&PTR_deinit_02147808 + lVar12),
               glcts::fixed_sample_locations_values + 1);
    (pBVar9->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BufferCase_02147928
    ;
    *(undefined4 *)&pBVar9[1].super_TestCase.super_TestNode._vptr_TestNode = 0x8f36;
    *(undefined4 *)((long)&pBVar9[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = uVar3;
    pBVar9[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x8f37000088e4;
    *(undefined4 *)&pBVar9[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = uVar4;
    *(undefined4 *)((long)&pBVar9[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p + 4) =
         0x88e4;
    pBVar9[1].super_TestCase.super_TestNode.m_name._M_string_length = local_78;
    *(undefined4 *)&pBVar9[1].super_TestCase.super_TestNode.m_name.field_2 = uVar5;
    *(undefined4 *)((long)&pBVar9[1].super_TestCase.super_TestNode.m_name.field_2 + 4) = 0;
    tcu::TestNode::addChild(pTVar10,(TestNode *)pBVar9);
    pTVar6 = local_60;
    lVar12 = lVar12 + 0x20;
  } while (lVar12 != 0xf8);
  pTVar10 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar10,pTVar6->m_testCtx,"single_buffer",
             "Copies within single buffer");
  local_58 = pTVar10;
  tcu::TestNode::addChild(pTVar6,pTVar10);
  lVar12 = 0;
  local_78 = 0;
  plVar8 = extraout_RAX;
  do {
    lVar13 = 0;
    do {
      if (lVar12 != lVar13) {
        dVar1 = init::bufferTargets[local_78];
        dVar2 = *(deUint32 *)((long)init::bufferTargets + lVar13);
        pcVar7 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar1);
        std::__cxx11::string::string<std::allocator<char>>((string *)local_50,pcVar7,&local_b9);
        plVar8 = (long *)std::__cxx11::string::append((char *)local_50);
        local_b8 = &local_a8;
        plVar11 = plVar8 + 2;
        if ((long *)*plVar8 == plVar11) {
          local_a8 = *plVar11;
          lStack_a0 = plVar8[3];
        }
        else {
          local_a8 = *plVar11;
          local_b8 = (long *)*plVar8;
        }
        local_b0 = plVar8[1];
        *plVar8 = (long)plVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        deqp::gls::BufferTestUtil::getBufferTargetName(dVar2);
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_b8);
        local_98 = &local_88;
        plVar11 = plVar8 + 2;
        if ((long *)*plVar8 == plVar11) {
          local_88 = *plVar11;
          lStack_80 = plVar8[3];
        }
        else {
          local_88 = *plVar11;
          local_98 = (long *)*plVar8;
        }
        local_90 = plVar8[1];
        *plVar8 = (long)plVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if (local_b8 != &local_a8) {
          operator_delete(local_b8,local_a8 + 1);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        pBVar9 = (BufferCase *)operator_new(0xd0);
        deqp::gls::BufferTestUtil::BufferCase::BufferCase
                  (pBVar9,(TestContext *)*local_60[1]._vptr_TestNode,
                   (RenderContext *)local_60[1]._vptr_TestNode[1],(char *)local_98,
                   glcts::fixed_sample_locations_values + 1);
        (pBVar9->super_TestCase).super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__BufferCase_02147978;
        *(deUint32 *)&pBVar9[1].super_TestCase.super_TestNode._vptr_TestNode = dVar1;
        *(deUint32 *)((long)&pBVar9[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = dVar2;
        pBVar9[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x88e4;
        tcu::TestNode::addChild(local_58,(TestNode *)pBVar9);
        plVar8 = &local_88;
        if (local_98 != plVar8) {
          operator_delete(local_98,local_88 + 1);
          plVar8 = extraout_RAX_00;
        }
      }
      lVar13 = lVar13 + 4;
    } while (lVar13 != 0x20);
    local_78 = local_78 + 1;
    lVar12 = lVar12 + 4;
  } while (local_78 != 8);
  return (int)plVar8;
}

Assistant:

void BufferCopyTests::init (void)
{
	static const deUint32 bufferTargets[] =
	{
		GL_ARRAY_BUFFER,
		GL_COPY_READ_BUFFER,
		GL_COPY_WRITE_BUFFER,
		GL_ELEMENT_ARRAY_BUFFER,
		GL_PIXEL_PACK_BUFFER,
		GL_PIXEL_UNPACK_BUFFER,
		GL_TRANSFORM_FEEDBACK_BUFFER,
		GL_UNIFORM_BUFFER
	};

	// .basic
	{
		tcu::TestCaseGroup* basicGroup = new tcu::TestCaseGroup(m_testCtx, "basic", "Basic buffer copy cases");
		addChild(basicGroup);

		for (int srcTargetNdx = 0; srcTargetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); srcTargetNdx++)
		{
			for (int dstTargetNdx = 0; dstTargetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); dstTargetNdx++)
			{
				if (srcTargetNdx == dstTargetNdx)
					continue;

				deUint32		srcTarget		= bufferTargets[srcTargetNdx];
				deUint32		dstTarget		= bufferTargets[dstTargetNdx];
				const int		size			= 1017;
				const deUint32	hint			= GL_STATIC_DRAW;
				VerifyType		verify			= VERIFY_AS_VERTEX_ARRAY;
				string			name			= string(getBufferTargetName(srcTarget)) + "_" + getBufferTargetName(dstTarget);

				basicGroup->addChild(new BasicBufferCopyCase(m_context, name.c_str(), "", srcTarget, size, hint, dstTarget, size, hint, 0, 0, size, verify));
			}
		}
	}

	// .subrange
	{
		tcu::TestCaseGroup* subrangeGroup = new tcu::TestCaseGroup(m_testCtx, "subrange", "Buffer subrange copy tests");
		addChild(subrangeGroup);

		static const struct
		{
			const char*		name;
			int				srcSize;
			int				dstSize;
			int				srcOffset;
			int				dstOffset;
			int				copySize;
		} cases[] =
		{
			//						srcSize		dstSize		srcOffs		dstOffs		copySize
			{ "middle",				1000,		1000,		250,		250,		500 },
			{ "small_to_large",		100,		1000,		0,			409,		100 },
			{ "large_to_small",		1000,		100,		409,		0,			100 },
			{ "low_to_high_1",		1000,		1000,		0,			500,		500 },
			{ "low_to_high_2",		997,		1027,		0,			701,		111 },
			{ "high_to_low_1",		1000,		1000,		500,		0,			500 },
			{ "high_to_low_2",		1027,		997,		701,		17,			111 }
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(cases); ndx++)
		{
			deUint32		srcTarget		= GL_COPY_READ_BUFFER;
			deUint32		dstTarget		= GL_COPY_WRITE_BUFFER;
			deUint32		hint			= GL_STATIC_DRAW;
			VerifyType		verify			= VERIFY_AS_VERTEX_ARRAY;

			subrangeGroup->addChild(new BasicBufferCopyCase(m_context, cases[ndx].name, "",
															srcTarget, cases[ndx].srcSize, hint,
															dstTarget, cases[ndx].dstSize, hint,
															cases[ndx].srcOffset, cases[ndx].dstOffset, cases[ndx].copySize,
															verify));
		}
	}

	// .single_buffer
	{
		tcu::TestCaseGroup* singleBufGroup = new tcu::TestCaseGroup(m_testCtx, "single_buffer", "Copies within single buffer");
		addChild(singleBufGroup);

		for (int srcTargetNdx = 0; srcTargetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); srcTargetNdx++)
		{
			for (int dstTargetNdx = 0; dstTargetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); dstTargetNdx++)
			{
				if (srcTargetNdx == dstTargetNdx)
					continue;

				deUint32		srcTarget		= bufferTargets[srcTargetNdx];
				deUint32		dstTarget		= bufferTargets[dstTargetNdx];
				const deUint32	hint			= GL_STATIC_DRAW;
				VerifyType		verify			= VERIFY_AS_VERTEX_ARRAY;
				string			name			= string(getBufferTargetName(srcTarget)) + "_" + getBufferTargetName(dstTarget);

				singleBufGroup->addChild(new SingleBufferCopyCase(m_context, name.c_str(), "", srcTarget, dstTarget, hint, verify));
			}
		}
	}
}